

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Distance<4>::doExpand
          (Distance<4> *this,ExpandContext *param_1,ArgExprs *args)

{
  ExprP<tcu::Vector<float,_4>_> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  ExprP<float> EVar1;
  ExprP<tcu::Vector<float,_4>_> local_38;
  ArgExprs *args_local;
  ExpandContext *param_1_local;
  Distance<4> *this_local;
  
  args_local = args;
  param_1_local = param_1;
  this_local = this;
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)&local_38,in_RCX,in_RCX + 1);
  length<4>((Functions *)this,&local_38);
  ExprP<tcu::Vector<float,_4>_>::~ExprP(&local_38);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_state = extraout_RDX;
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_ptr = (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>;
}

Assistant:

ExprP<Ret>	doExpand	(ExpandContext&, const ArgExprs& args) const
	{
		return length<Size>(args.a - args.b);
	}